

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  
  iVar13 = a->h * a->w * a->d * a->elempack;
  uVar16 = 0;
  uVar14 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar14 = uVar16;
  }
  for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
    lVar17 = a->elemsize * a->cstep * uVar16;
    pvVar4 = a->data;
    lVar18 = b->elemsize * b->cstep * uVar16;
    pvVar5 = b->data;
    lVar19 = c->elemsize * c->cstep * uVar16;
    pvVar6 = c->data;
    lVar15 = 0;
    lVar20 = 0;
    for (iVar21 = 0; iVar21 + 3 < iVar13; iVar21 = iVar21 + 4) {
      pfVar1 = (float *)((long)pvVar4 + lVar20 + lVar17);
      fVar7 = pfVar1[1];
      fVar8 = pfVar1[2];
      fVar9 = pfVar1[3];
      pfVar2 = (float *)((long)pvVar5 + lVar20 + lVar18);
      fVar10 = pfVar2[1];
      fVar11 = pfVar2[2];
      fVar12 = pfVar2[3];
      pfVar3 = (float *)((long)pvVar6 + lVar20 + lVar19);
      *pfVar3 = *pfVar1 - *pfVar2;
      pfVar3[1] = fVar7 - fVar10;
      pfVar3[2] = fVar8 - fVar11;
      pfVar3[3] = fVar9 - fVar12;
      lVar20 = lVar20 + 0x10;
      lVar15 = lVar15 + 4;
    }
    for (; (int)lVar15 < iVar13; lVar15 = lVar15 + 1) {
      *(float *)((long)pvVar6 + lVar15 * 4 + lVar19) =
           *(float *)((long)pvVar4 + lVar15 * 4 + lVar17) -
           *(float *)((long)pvVar5 + lVar15 * 4 + lVar18);
    }
  }
  return iVar13;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}